

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::r_formatter<spdlog::details::scoped_padder>::format
          (r_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  int iVar1;
  size_t sVar2;
  undefined2 uVar3;
  int n;
  ulong uVar4;
  scoped_padder p;
  scoped_padder local_40;
  
  scoped_padder::scoped_padder(&local_40,0xb,&(this->super_flag_formatter).padinfo_,dest);
  iVar1 = tm_time->tm_hour;
  n = iVar1 + -0xc;
  if (iVar1 < 0xd) {
    n = iVar1;
  }
  fmt_helper::pad2(n,dest);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ':';
  fmt_helper::pad2(tm_time->tm_min,dest);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ':';
  fmt_helper::pad2(tm_time->tm_sec,dest);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  iVar1 = tm_time->tm_hour;
  uVar4 = (dest->super_buffer<char>).size_ + 2;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar4);
  }
  uVar3 = 0x4d41;
  if (0xb < iVar1) {
    uVar3 = 0x4d50;
  }
  *(undefined2 *)((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_) = uVar3;
  (dest->super_buffer<char>).size_ = uVar4;
  scoped_padder::~scoped_padder(&local_40);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }